

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O1

void __thiscall
test::syntax_tests::iu_SyntaxTest_x_iutest_x_ExceptionValueFormat_Test::Body
          (iu_SyntaxTest_x_iutest_x_ExceptionValueFormat_Test *this)

{
  undefined4 *puVar1;
  AssertionResult iutest_ar;
  AssertionResult ar;
  
  puVar1 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar1 = 0x3dcccccd;
  __cxa_throw(puVar1,&float::typeinfo,0);
}

Assistant:

IUTEST(SyntaxTest, GT)
{
    if( int x = 1 )
        IUTEST_ASSERT_GT(2, x) << x;
    if( int x = 1 )
        IUTEST_EXPECT_GT(2, x) << x;
    if( int x = 1 )
        IUTEST_INFORM_GT(2, x) << x;
    if( int x = 1 )
        IUTEST_ASSUME_GT(2, x) << x;
}